

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_nb_type(connectdata *conn,_Bool ascii,ftpstate newstate)

{
  char cVar1;
  char want;
  CURLcode result;
  ftp_conn *ftpc;
  ftpstate newstate_local;
  _Bool ascii_local;
  connectdata *conn_local;
  
  cVar1 = 'I';
  if (ascii) {
    cVar1 = 'A';
  }
  if ((conn->proto).ftpc.transfertype == cVar1) {
    _state(conn,newstate);
    conn_local._4_4_ = ftp_state_type_resp(conn,200,newstate);
  }
  else {
    conn_local._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"TYPE %c",(ulong)(uint)(int)cVar1);
    if (conn_local._4_4_ == CURLE_OK) {
      _state(conn,newstate);
      (conn->proto).ftpc.transfertype = cVar1;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_nb_type(struct connectdata *conn,
                            bool ascii, ftpstate newstate)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  char want = (char)(ascii?'A':'I');

  if(ftpc->transfertype == want) {
    state(conn, newstate);
    return ftp_state_type_resp(conn, 200, newstate);
  }

  result = Curl_pp_sendf(&ftpc->pp, "TYPE %c", want);
  if(!result) {
    state(conn, newstate);

    /* keep track of our current transfer type */
    ftpc->transfertype = want;
  }
  return result;
}